

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString::Builder<256u>>
               (char16 c,Builder<256U> *toString)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  CharCount CVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x355,"(toString)","toString");
    if (!bVar3) goto LAB_00bc5cd6;
    *puVar5 = 0;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x356,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) goto LAB_00bc5cd6;
    *puVar5 = 0;
  }
  if (toString->directCharLength != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x358,"(toString->HasOnlyDirectChars())",
                                "toString->HasOnlyDirectChars()");
    if (!bVar3) {
LAB_00bc5cd6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar1 = toString->charLength;
  CVar4 = Block::CharCapacityFromPointerCapacity(0x40);
  if (uVar1 < CVar4) {
    pcVar6 = Block::Chars(toString);
    pcVar6[uVar1] = c;
    Builder<256U>::SetLength(toString,toString->stringLength + 1);
    toString->charLength = uVar1 + 1;
  }
  return uVar1 < CVar4;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(const char16 c, String *const toString)
    {
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(toString->HasOnlyDirectChars());

        const CharCount blockCharLength = toString->LastBlockCharLength();
        if(blockCharLength < toString->LastBlockCharCapacity())
        {
            toString->LastBlockChars()[blockCharLength] = c;
            toString->SetLength(toString->GetLength() + 1);
            toString->SetLastBlockCharLength(blockCharLength + 1);
            return true;
        }
        return false;
    }